

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Cloner::RetargetClonedBranches(Cloner *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BranchInstr *this_00;
  Instr *local_38;
  Instr *local_28;
  Instr *instr;
  Instr *instrStop;
  Instr *__prevInstrCheck;
  Cloner *this_local;
  
  if (this->fRetargetClonedBranch != 0) {
    instrStop = (Instr *)0x0;
    if (this->instrLast == (Instr *)0x0) {
      local_38 = (Instr *)0x0;
    }
    else {
      local_38 = this->instrLast->m_next;
    }
    for (local_28 = this->instrFirst; local_28 != local_38; local_28 = local_28->m_next) {
      if ((instrStop != (Instr *)0x0) && (instrStop->m_next != local_28)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x78d,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      instrStop = local_28;
      bVar2 = IR::Instr::IsBranchInstr(local_28);
      if (bVar2) {
        this_00 = IR::Instr::AsBranchInstr(local_28);
        IR::BranchInstr::RetargetClonedBranch(this_00);
      }
    }
  }
  return;
}

Assistant:

void
Cloner::RetargetClonedBranches()
{
    if (!this->fRetargetClonedBranch)
    {
        return;
    }

    FOREACH_INSTR_IN_RANGE(instr, this->instrFirst, this->instrLast)
    {
        if (instr->IsBranchInstr())
        {
            instr->AsBranchInstr()->RetargetClonedBranch();
        }
    }
    NEXT_INSTR_IN_RANGE;
}